

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O2

jdouble Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1rho2_1get
                  (JNIEnv *jenv,jclass jcls,jlong jarg1,jobject jarg1_)

{
  return *(jdouble *)(jarg1 + 0x70);
}

Assistant:

SWIGEXPORT jdouble JNICALL Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1rho2_1get(JNIEnv *jenv, jclass jcls, jlong jarg1, jobject jarg1_) {
  jdouble jresult = 0 ;
  opt_s *arg1 = (opt_s *) 0 ;
  double result;
  
  (void)jenv;
  (void)jcls;
  (void)jarg1_;
  arg1 = *(opt_s **)&jarg1; 
  result = (double) ((arg1)->rho2);
  jresult = (jdouble)result; 
  return jresult;
}